

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcShow.c
# Opt level: O0

void Abc_NtkShow(Abc_Ntk_t *pNtk0,int fGateNames,int fSeq,int fUseReverse)

{
  int iVar1;
  FILE *__stream;
  Abc_Ntk_t *pNtk_00;
  Vec_Ptr_t *p;
  Abc_Obj_t *Entry;
  int local_11c;
  char local_118 [4];
  int i;
  char FileNameDot [200];
  int nBarBufs;
  Vec_Ptr_t *vNodes;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtk;
  FILE *pFile;
  int fUseReverse_local;
  int fSeq_local;
  int fGateNames_local;
  Abc_Ntk_t *pNtk0_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk0);
  if ((iVar1 == 0) && (iVar1 = Abc_NtkIsLogic(pNtk0), iVar1 == 0)) {
    __assert_fail("Abc_NtkIsStrash(pNtk0) || Abc_NtkIsLogic(pNtk0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcShow.c"
                  ,0xca,"void Abc_NtkShow(Abc_Ntk_t *, int, int, int)");
  }
  iVar1 = Abc_NtkIsStrash(pNtk0);
  if ((iVar1 == 0) || (iVar1 = Abc_NtkGetChoiceNum(pNtk0), iVar1 == 0)) {
    Abc_ShowGetFileName(pNtk0->pName,local_118);
    __stream = fopen(local_118,"w");
    if (__stream == (FILE *)0x0) {
      fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",local_118);
    }
    else {
      fclose(__stream);
      pNtk_00 = Abc_NtkDup(pNtk0);
      iVar1 = Abc_NtkIsLogic(pNtk_00);
      if ((iVar1 != 0) && (iVar1 = Abc_NtkHasMapping(pNtk_00), iVar1 == 0)) {
        Abc_NtkToSop(pNtk_00,-1,1000000000);
      }
      p = Vec_PtrAlloc(100);
      for (local_11c = 0; iVar1 = Vec_PtrSize(pNtk_00->vObjs), local_11c < iVar1;
          local_11c = local_11c + 1) {
        Entry = Abc_NtkObj(pNtk_00,local_11c);
        if (Entry != (Abc_Obj_t *)0x0) {
          Vec_PtrPush(p,Entry);
        }
      }
      iVar1 = pNtk_00->nBarBufs;
      pNtk_00->nBarBufs = 0;
      if (fSeq == 0) {
        Io_WriteDotNtk(pNtk_00,p,(Vec_Ptr_t *)0x0,local_118,fGateNames,fUseReverse);
      }
      else {
        Io_WriteDotSeq(pNtk_00,p,(Vec_Ptr_t *)0x0,local_118,fGateNames,fUseReverse);
      }
      pNtk_00->nBarBufs = iVar1;
      Vec_PtrFree(p);
      Abc_ShowFile(local_118);
      Abc_NtkDelete(pNtk_00);
    }
  }
  else {
    printf("Temporarily visualization of AIGs with choice nodes is disabled.\n");
  }
  return;
}

Assistant:

void Abc_NtkShow( Abc_Ntk_t * pNtk0, int fGateNames, int fSeq, int fUseReverse )
{
    FILE * pFile;
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pNode;
    Vec_Ptr_t * vNodes;
    int nBarBufs;
    char FileNameDot[200];
    int i;

    assert( Abc_NtkIsStrash(pNtk0) || Abc_NtkIsLogic(pNtk0) );
    if ( Abc_NtkIsStrash(pNtk0) && Abc_NtkGetChoiceNum(pNtk0) )
    {
        printf( "Temporarily visualization of AIGs with choice nodes is disabled.\n" );
        return;
    }
    // create the file name
    Abc_ShowGetFileName( pNtk0->pName, FileNameDot );
    // check that the file can be opened
    if ( (pFile = fopen( FileNameDot, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", FileNameDot );
        return;
    }
    fclose( pFile );


    // convert to logic SOP
    pNtk = Abc_NtkDup( pNtk0 );
    if ( Abc_NtkIsLogic(pNtk) && !Abc_NtkHasMapping(pNtk) )
        Abc_NtkToSop( pNtk, -1, ABC_INFINITY );

    // collect all nodes in the network
    vNodes = Vec_PtrAlloc( 100 );
    Abc_NtkForEachObj( pNtk, pNode, i )
        Vec_PtrPush( vNodes, pNode );
    // write the DOT file
    nBarBufs = pNtk->nBarBufs;
    pNtk->nBarBufs = 0;
    if ( fSeq )
        Io_WriteDotSeq( pNtk, vNodes, NULL, FileNameDot, fGateNames, fUseReverse );
    else
        Io_WriteDotNtk( pNtk, vNodes, NULL, FileNameDot, fGateNames, fUseReverse );
    pNtk->nBarBufs = nBarBufs;
    Vec_PtrFree( vNodes );

    // visualize the file 
    Abc_ShowFile( FileNameDot );
    Abc_NtkDelete( pNtk );
}